

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmTrapcc<(moira::Instr)169,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  uint in_EAX;
  StrWriter *this_00;
  undefined8 uStack_18;
  
  SVar1 = str->style->syntax;
  uStack_18._0_4_ = in_EAX;
  this_00 = StrWriter::operator<<(str);
  if ((SVar1 & ~MOIRA_MIT) != GNU) {
    StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  }
  uStack_18 = (ulong)(uint)uStack_18;
  StrWriter::operator<<(str,(Av<(moira::Instr)169,_(moira::Mode)12,_1> *)((long)&uStack_18 + 4));
  return;
}

Assistant:

void
Moira::dasmTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (S) {

                case Byte:

                    str << Ins<I>{};
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(ext);
                    break;
            }
            break;

        default:

            switch (S) {

                case Byte:

                    str << Ins<I>{} << str.tab;
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << str.tab << Imu(ext);
                    break;
            }
    }

    str << Av<I, M, S>{};
}